

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::internal::ArenaImpl::FreeBlocks(ArenaImpl *this)

{
  __pointer_type this_00;
  uint64 uVar1;
  _func_void_void_ptr_size_t *unaff_retaddr;
  SerialArena *next;
  SerialArena *serial;
  uint64 space_allocated;
  undefined8 in_stack_ffffffffffffffe0;
  atomic<google::protobuf::internal::ArenaImpl::SerialArena_*> *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  
  local_10 = 0;
  this_00 = std::atomic<google::protobuf::internal::ArenaImpl::SerialArena_*>::load
                      (in_stack_ffffffffffffffe8,
                       (memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  while (this_00 != (SerialArena *)0x0) {
    this_00 = SerialArena::next(this_00);
    uVar1 = SerialArena::Free(serial,(Block *)next,unaff_retaddr);
    local_10 = uVar1 + local_10;
  }
  return local_10;
}

Assistant:

uint64 ArenaImpl::FreeBlocks() {
  uint64 space_allocated = 0;
  // By omitting an Acquire barrier we ensure that any user code that doesn't
  // properly synchronize Reset() or the destructor will throw a TSAN warning.
  SerialArena* serial = threads_.load(std::memory_order_relaxed);

  while (serial) {
    // This is inside a block we are freeing, so we need to read it now.
    SerialArena* next = serial->next();
    space_allocated += ArenaImpl::SerialArena::Free(serial, initial_block_,
                                                    options_.block_dealloc);
    // serial is dead now.
    serial = next;
  }

  return space_allocated;
}